

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timetrans.cpp
# Opt level: O0

bool BDST2GPST(SATTIME bdst,SATTIME *gpst)

{
  SATTIME *gpst_local;
  SATTIME bdst_local;
  
  gpst->Week = bdst.Week + 0x54c;
  gpst->SOW = bdst.SOW + 14.0;
  if (604800.0 <= gpst->SOW) {
    gpst->SOW = gpst->SOW - 604800.0;
    gpst->Week = gpst->Week + 1;
  }
  return true;
}

Assistant:

bool BDST2GPST(const SATTIME bdst, SATTIME &gpst)
{
    gpst.Week = bdst.Week + 1356;
    gpst.SOW = bdst.SOW + 14;
    if(gpst.SOW >= 604800 )
    {
        gpst.SOW -= 604800;
        gpst.Week += 1;
    }
    return true;
}